

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.h
# Opt level: O3

void __thiscall
flow::UnaryInstr<(flow::UnaryOperator)1,_(flow::LiteralType)2>::UnaryInstr
          (UnaryInstr<(flow::UnaryOperator)1,_(flow::LiteralType)2> *this,Value *op,string *name)

{
  initializer_list<flow::Value_*> __l;
  allocator_type local_39;
  vector<flow::Value_*,_std::allocator<flow::Value_*>_> local_38;
  Value *local_20;
  
  __l._M_len = 1;
  __l._M_array = &local_20;
  local_20 = op;
  std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::vector(&local_38,__l,&local_39);
  Instr::Instr(&this->super_Instr,Number,&local_38,name);
  if (local_38.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  (this->super_Instr).super_Value._vptr_Value = (_func_int **)&PTR__Instr_0019c510;
  this->operator_ = INot;
  return;
}

Assistant:

UnaryInstr(Value* op, const std::string& name)
      : Instr(ResultType, {op}, name), operator_(Operator) {}